

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O0

void __thiscall
nn::ESoinn::labelClasses
          (ESoinn *this,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *node_axis)

{
  ConcreteLogger *this_00;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  uint32_t local_58;
  uint local_54;
  uint32_t num_axis;
  uint32_t i_1;
  uint32_t i;
  allocator local_39;
  string local_38;
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  *local_18;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *node_axis_local;
  ESoinn *this_local;
  
  this_00 = log_netw;
  local_18 = (map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)node_axis;
  node_axis_local =
       (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"labelClasses function",&local_39);
  logger::ConcreteLogger::debug(this_00,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  for (num_axis = 0; uVar2 = (ulong)num_axis,
      sVar3 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                        (&this->m_Neurons), uVar2 < sVar3; num_axis = num_axis + 1) {
    pvVar4 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                       (&this->m_Neurons,(ulong)num_axis);
    bVar1 = neuron::ESoinnNeuron::is_deleted(pvVar4);
    if (!bVar1) {
      isNodeAxis(this,num_axis);
    }
  }
  for (local_54 = 0; uVar2 = (ulong)local_54,
      sVar3 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                        (&this->m_Neurons), uVar2 < sVar3; local_54 = local_54 + 1) {
    pvVar4 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                       (&this->m_Neurons,(ulong)local_54);
    bVar1 = neuron::ESoinnNeuron::is_deleted(pvVar4);
    if (!bVar1) {
      local_58 = findAxisForNode(this,local_54);
      std::
      map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
      ::emplace<unsigned_int&,unsigned_int&>(local_18,&local_54,&local_58);
      pvVar4 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                         (&this->m_Neurons,(ulong)local_54);
      neuron::ESoinnNeuron::setCurClass(pvVar4,local_58);
    }
  }
  return;
}

Assistant:

void ESoinn::labelClasses(std::map<uint32_t, uint32_t>& node_axis)
    {
        log_netw->debug("labelClasses function");
        //find neighbour with max density for each neuron
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            isNodeAxis(i);
        }
        
        //find axis for each node
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            uint32_t num_axis = findAxisForNode(i);
            node_axis.emplace(i, num_axis);
            m_Neurons[i].setCurClass(num_axis);
        }
    }